

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomOneAction.cpp
# Opt level: O2

ActionResults * __thiscall GreenRoomOneAction::Go(GreenRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *this_00;
  string *this_01;
  itemType local_9c;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == WEST) {
    local_9c = G_ROOM_STATE;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_9c);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 == NOT_WON) {
      this_00 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_38,"The path is blocked.\n",(allocator *)&local_9c);
      ActionResults::ActionResults(this_00,CURRENT,&local_38);
      this_01 = &local_38;
      goto LAB_001179a6;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == WEST) {
    local_9c = G_ROOM_STATE;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_9c);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 == WON) {
      local_9c = PLAYER;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_9c);
      ItemWrapper::setLocation(pIVar3,G_ROOM2_BUCKET);
      this_00 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"You move to the green room 2",(allocator *)&local_9c);
      ActionResults::ActionResults(this_00,G_ROOM2_BUCKET,&local_58);
      this_01 = &local_58;
      goto LAB_001179a6;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  this_00 = (ActionResults *)operator_new(0x30);
  if (iVar1 == EAST) {
    std::__cxx11::string::string
              ((string *)&local_78,"You can\'t go back, the door is locked.",(allocator *)&local_9c)
    ;
    ActionResults::ActionResults(this_00,CURRENT,&local_78);
    this_01 = &local_78;
  }
  else {
    std::__cxx11::string::string((string *)&local_98,"You can\'t go there.",(allocator *)&local_9c);
    ActionResults::ActionResults(this_00,CURRENT,&local_98);
    this_01 = &local_98;
  }
LAB_001179a6:
  std::__cxx11::string::~string((string *)this_01);
  return this_00;
}

Assistant:

ActionResults *GreenRoomOneAction::Go() {

    if (commands->getMainItem() == WEST && itemList->getValue(G_ROOM_STATE)->getLocation() == NOT_WON) {
        return new ActionResults(CURRENT, "The path is blocked.\n");
    } else if (commands->getMainItem() == WEST && itemList->getValue(G_ROOM_STATE)->getLocation() == WON){
        itemList->getValue(PLAYER)->setLocation(G_ROOM2_BUCKET);
        return new ActionResults(G_ROOM2_BUCKET, "You move to the green room 2");
    } else if (commands->getMainItem() == EAST) {
        return new ActionResults(CURRENT, "You can't go back, the door is locked.");
    }
    return new ActionResults(CURRENT,"You can't go there.");
}